

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.cpp
# Opt level: O3

bool add_packed_varyings(gl_context *ctx,gl_shader_program *shProg,set *resource_set,int stage,
                        GLenum type)

{
  char cVar1;
  undefined8 *puVar2;
  char *__s2;
  long lVar3;
  long *plVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  char *__ptr;
  char *pcVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long *plVar14;
  glsl_type *in_stack_ffffffffffffff80;
  char *local_38;
  
  iVar12 = (int)resource_set;
  lVar13 = *(long *)((ctx->GLThread).queue.name + (long)iVar12 * 8 + 0x78);
  if (((lVar13 != 0) && (puVar2 = *(undefined8 **)(lVar13 + 0x28), puVar2 != (undefined8 *)0x0)) &&
     (plVar14 = (long *)*puVar2, *plVar14 != 0)) {
    do {
      if ((int)plVar14[2] == 7) {
        uVar11 = *(uint *)(plVar14 + 7) >> 0xc & 0xf;
        iVar7 = 0x92e3;
        if (uVar11 != 4) {
          if (uVar11 != 5) {
            __assert_fail("!\"unexpected type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/linker.cpp"
                          ,0xf97,
                          "bool add_packed_varyings(const struct gl_context *, struct gl_shader_program *, struct set *, int, GLenum)"
                         );
          }
          iVar7 = 0x92e4;
        }
        if (iVar7 == stage) {
          __s2 = (char *)plVar14[4];
          lVar13 = 0;
          bVar10 = 0;
          do {
            lVar3 = *(long *)((ctx->GLThread).queue.name + lVar13 * 8 + 0x78);
            if (lVar3 != 0) {
              plVar4 = (long *)**(undefined8 **)(lVar3 + 0x20);
              lVar3 = *plVar4;
              while (lVar3 != 0) {
                if ((int)plVar4[2] == 7) {
                  pcVar9 = (char *)plVar4[4];
                  sVar8 = strlen(pcVar9);
                  in_stack_ffffffffffffff80 = (glsl_type *)0x166540;
                  iVar7 = strncmp(pcVar9,"packed:",7);
                  if (iVar7 == 0) {
                    __ptr = strdup(pcVar9 + 7);
                    pcVar9 = __ptr;
                    if (__ptr == (char *)0x0) {
                      __assert_fail("list",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/linker.cpp"
                                    ,0xe15,
                                    "bool included_in_packed_varying(ir_variable *, const char *)");
                    }
                    while (pcVar9 = strtok_r(pcVar9,",",&local_38), pcVar9 != (char *)0x0) {
                      iVar7 = strcmp(pcVar9,__s2);
                      if (iVar7 == 0) {
                        in_stack_ffffffffffffff80 = (glsl_type *)0x1665dd;
                        free(__ptr);
                        goto LAB_001665dd;
                      }
                      pcVar9 = (char *)0x0;
                    }
                    in_stack_ffffffffffffff80 = (glsl_type *)0x16658e;
                    free(__ptr);
                  }
                  if ((*(uint *)(plVar4 + 7) >> 0xc & 0xf) == uVar11) {
                    in_stack_ffffffffffffff80 = (glsl_type *)0x1665af;
                    iVar7 = strncmp((char *)plVar4[4],__s2,sVar8 & 0xffffffff);
                    if ((iVar7 == 0) &&
                       (((cVar1 = __s2[sVar8 & 0xffffffff], cVar1 == '\0' || (cVar1 == '[')) ||
                        (cVar1 == '.')))) {
LAB_001665dd:
                      bVar10 = bVar10 | (byte)(1 << ((byte)lVar13 & 0x1f));
                      break;
                    }
                  }
                }
                plVar4 = (long *)*plVar4;
                lVar3 = *plVar4;
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 6);
          if ((*(uint *)(plVar14 + 7) & 8) == 0) {
            uVar11 = *(uint *)(plVar14 + 7) >> 0xc & 0xf;
            bVar5 = 1;
            if ((uVar11 != 5 || iVar12 != 1) && (2 < iVar12 - 1U || uVar11 != 4)) goto LAB_00166638;
          }
          else {
LAB_00166638:
            bVar5 = 0;
          }
          bVar6 = add_shader_variable(ctx,shProg,(set *)(ulong)bVar10,stage,(int)plVar14 - 8,
                                      (ir_variable *)plVar14[4],(char *)plVar14[3],(glsl_type *)0x0,
                                      (bool)((char)(int)plVar14[9] + -0x20),(uint)bVar5,false,
                                      in_stack_ffffffffffffff80);
          if (!bVar6) {
            return false;
          }
        }
      }
      plVar14 = (long *)*plVar14;
    } while (*plVar14 != 0);
  }
  return true;
}

Assistant:

static bool
add_packed_varyings(const struct gl_context *ctx,
                    struct gl_shader_program *shProg,
                    struct set *resource_set,
                    int stage, GLenum type)
{
   struct gl_linked_shader *sh = shProg->_LinkedShaders[stage];
   GLenum iface;

   if (!sh || !sh->packed_varyings)
      return true;

   foreach_in_list(ir_instruction, node, sh->packed_varyings) {
      ir_variable *var = node->as_variable();
      if (var) {
         switch (var->data.mode) {
         case ir_var_shader_in:
            iface = GL_PROGRAM_INPUT;
            break;
         case ir_var_shader_out:
            iface = GL_PROGRAM_OUTPUT;
            break;
         default:
            unreachable("unexpected type");
         }

         if (type == iface) {
            const int stage_mask =
               build_stageref(shProg, var->name, var->data.mode);
            if (!add_shader_variable(ctx, shProg, resource_set,
                                     stage_mask,
                                     iface, var, var->name, var->type, false,
                                     var->data.location - VARYING_SLOT_VAR0,
                                     inout_has_same_location(var, stage)))
               return false;
         }
      }
   }
   return true;
}